

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O2

void p_uthread_replace_local(PUThreadKey *key,ppointer value)

{
  int iVar1;
  pthread_key_t *ppVar2;
  void *pvVar3;
  
  if (key != (PUThreadKey *)0x0) {
    ppVar2 = pp_uthread_get_tls_key(key);
    if (ppVar2 != (pthread_key_t *)0x0) {
      pvVar3 = pthread_getspecific(*ppVar2);
      if ((pvVar3 != (void *)0x0) && (key->free_func != (PDestroyFunc)0x0)) {
        (*key->free_func)(pvVar3);
      }
      iVar1 = pthread_setspecific(*ppVar2,value);
      if (iVar1 != 0) {
        printf("** Error: %s **\n","PUThread::p_uthread_replace_local: pthread_setspecific() failed"
              );
        return;
      }
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_uthread_replace_local	(PUThreadKey	*key,
			 ppointer	value)
{
	pthread_key_t	*tls_key;
	ppointer	old_value;

	if (P_UNLIKELY (key == NULL))
		return;

	tls_key = pp_uthread_get_tls_key (key);

	if (P_UNLIKELY (tls_key == NULL))
		return;

#ifdef P_OS_SCO
	if (P_UNLIKELY (pthread_getspecific (*tls_key, &old_value) != 0))
		return;
#else
	old_value = pthread_getspecific (*tls_key);
#endif

	if (old_value != NULL && key->free_func != NULL)
		key->free_func (old_value);

	if (P_UNLIKELY (pthread_setspecific (*tls_key, value) != 0))
		P_ERROR ("PUThread::p_uthread_replace_local: pthread_setspecific() failed");
}